

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O2

bool __thiscall pugi::xml_node::traverse(xml_node *this,xml_tree_walker *walker)

{
  undefined1 uVar1;
  int iVar2;
  xml_node_struct *pxVar3;
  xml_node_struct *pxVar4;
  xml_node_struct *pxVar5;
  xml_node arg_end;
  xml_node arg_begin;
  xml_node_struct *local_30;
  xml_node_struct *local_28;
  
  walker->_depth = -1;
  local_28 = this->_root;
  iVar2 = (*walker->_vptr_xml_tree_walker[2])(walker);
  if ((char)iVar2 == '\0') {
LAB_0011fb3a:
    uVar1 = 0;
  }
  else {
    pxVar3 = this->_root;
    if (pxVar3 == (xml_node_struct *)0x0) {
      pxVar3 = (xml_node_struct *)0x0;
    }
    else {
      pxVar5 = pxVar3->first_child;
      if (pxVar5 != (xml_node_struct *)0x0) {
        walker->_depth = walker->_depth + 1;
        do {
          local_30 = pxVar5;
          iVar2 = (*walker->_vptr_xml_tree_walker[3])(walker,&local_30);
          if ((char)iVar2 == '\0') goto LAB_0011fb3a;
          pxVar4 = pxVar5->first_child;
          if (pxVar4 == (xml_node_struct *)0x0) {
            pxVar4 = pxVar5->next_sibling;
            if (pxVar4 != (xml_node_struct *)0x0) goto LAB_0011faf4;
            pxVar4 = (xml_node_struct *)0x0;
            while( true ) {
              pxVar3 = this->_root;
              if ((pxVar4 != (xml_node_struct *)0x0) || (pxVar5 == pxVar3)) break;
              pxVar5 = pxVar5->parent;
              if (pxVar5 == (xml_node_struct *)0x0) {
                pxVar4 = (xml_node_struct *)0x0;
                goto LAB_0011faf7;
              }
              walker->_depth = walker->_depth + -1;
              pxVar4 = pxVar5->next_sibling;
            }
            if (pxVar5 == pxVar3) {
              pxVar4 = pxVar5;
            }
          }
          else {
            walker->_depth = walker->_depth + 1;
LAB_0011faf4:
            pxVar3 = this->_root;
          }
LAB_0011faf7:
        } while ((pxVar4 != (xml_node_struct *)0x0) && (pxVar5 = pxVar4, pxVar4 != pxVar3));
      }
    }
    if (walker->_depth != -1) {
      __assert_fail("walker._depth == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                    ,0x18b3,"bool pugi::xml_node::traverse(xml_tree_walker &)");
    }
    local_30 = pxVar3;
    iVar2 = (*walker->_vptr_xml_tree_walker[4])(walker);
    uVar1 = (undefined1)iVar2;
  }
  return (bool)uVar1;
}

Assistant:

PUGI__FN bool xml_node::traverse(xml_tree_walker& walker)
	{
		walker._depth = -1;

		xml_node arg_begin(_root);
		if (!walker.begin(arg_begin)) return false;

		xml_node_struct* cur = _root ? _root->first_child + 0 : 0;

		if (cur)
		{
			++walker._depth;

			do
			{
				xml_node arg_for_each(cur);
				if (!walker.for_each(arg_for_each))
					return false;

				if (cur->first_child)
				{
					++walker._depth;
					cur = cur->first_child;
				}
				else if (cur->next_sibling)
					cur = cur->next_sibling;
				else
				{
					while (!cur->next_sibling && cur != _root && cur->parent)
					{
						--walker._depth;
						cur = cur->parent;
					}

					if (cur != _root)
						cur = cur->next_sibling;
				}
			}
			while (cur && cur != _root);
		}

		assert(walker._depth == -1);

		xml_node arg_end(_root);
		return walker.end(arg_end);
	}